

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

void __thiscall
chaiscript::Type_Conversions::add_conversion
          (Type_Conversions *this,shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion)

{
  Type_Info t_to;
  Type_Info t_from;
  initializer_list<const_std::type_info_*> __l;
  bool bVar1;
  element_type *peVar2;
  Type_Info *pTVar3;
  Type_Info *from;
  conversion_error *this_00;
  size_type __i;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_bool>
  pVar4;
  type_info *local_c8;
  type_info *local_c0;
  iterator local_b8;
  undefined8 local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  Static_String local_98;
  type_info *local_88;
  type_info *ptStack_80;
  undefined8 local_78;
  type_info *local_68;
  type_info *ptStack_60;
  undefined8 local_58;
  _Self local_48 [3];
  _Self local_30;
  undefined1 local_28 [8];
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion_local;
  Type_Conversions *this_local;
  
  l._8_8_ = conversion;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)local_28,&this->m_mutex);
  peVar2 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)l._8_8_);
  pTVar3 = detail::Type_Conversion_Base::to(peVar2);
  peVar2 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)l._8_8_);
  from = detail::Type_Conversion_Base::from(peVar2);
  local_30._M_node = (_Base_ptr)find_bidir(this,pTVar3,from);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
       ::end(&this->m_conversions);
  bVar1 = std::operator==(&local_30,local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pVar4 = std::
            set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
            ::insert(&this->m_conversions,(value_type *)l._8_8_);
    local_a8 = (_Base_ptr)pVar4.first._M_node;
    local_a0 = pVar4.second;
    peVar2 = std::
             __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)l._8_8_);
    pTVar3 = detail::Type_Conversion_Base::to(peVar2);
    local_c8 = Type_Info::bare_type_info(pTVar3);
    peVar2 = std::
             __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)l._8_8_);
    pTVar3 = detail::Type_Conversion_Base::from(peVar2);
    local_c0 = Type_Info::bare_type_info(pTVar3);
    local_b8 = &local_c8;
    local_b0 = 2;
    __l._M_len = 2;
    __l._M_array = local_b8;
    std::
    set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::insert(&this->m_convertableTypes,__l);
    __i = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::size(&this->m_convertableTypes);
    std::__atomic_base<unsigned_long>::operator=
              (&(this->m_num_types).super___atomic_base<unsigned_long>,__i);
    std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_28);
    return;
  }
  this_00 = (conversion_error *)__cxa_allocate_exception(0x50);
  peVar2 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)l._8_8_);
  pTVar3 = detail::Type_Conversion_Base::to(peVar2);
  local_58 = *(undefined8 *)&pTVar3->m_flags;
  local_68 = pTVar3->m_type_info;
  ptStack_60 = pTVar3->m_bare_type_info;
  peVar2 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)l._8_8_);
  pTVar3 = detail::Type_Conversion_Base::from(peVar2);
  local_78 = *(undefined8 *)&pTVar3->m_flags;
  local_88 = pTVar3->m_type_info;
  ptStack_80 = pTVar3->m_bare_type_info;
  utility::Static_String::Static_String<44ul>
            (&local_98,(char (*) [44])"Trying to re-insert an existing conversion!");
  t_to.m_bare_type_info = ptStack_60;
  t_to.m_type_info = local_68;
  t_to._16_8_ = local_58;
  t_from.m_bare_type_info = ptStack_80;
  t_from.m_type_info = local_88;
  t_from._16_8_ = local_78;
  exception::conversion_error::conversion_error(this_00,t_to,t_from,local_98);
  __cxa_throw(this_00,&exception::conversion_error::typeinfo,
              exception::conversion_error::~conversion_error);
}

Assistant:

void add_conversion(const std::shared_ptr<detail::Type_Conversion_Base> &conversion) {
      chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
      if (find_bidir(conversion->to(), conversion->from()) != m_conversions.end()) {
        throw exception::conversion_error(conversion->to(), conversion->from(), "Trying to re-insert an existing conversion!");
      }
      m_conversions.insert(conversion);
      m_convertableTypes.insert({conversion->to().bare_type_info(), conversion->from().bare_type_info()});
      m_num_types = m_convertableTypes.size();
    }